

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source)

{
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  
  uVar1 = (this->data_).size_;
  if (uVar1 == (source->data_).size_) {
    pfVar2 = (source->data_).mem_;
    pfVar3 = (this->data_).mem_;
    for (uVar4 = 0; (~((long)uVar1 >> 0x3f) & uVar1) != uVar4; uVar4 = uVar4 + 1) {
      pfVar3[uVar4] = pfVar2[uVar4] + pfVar3[uVar4];
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/vector.cc"
                ,0x29,"void fasttext::Vector::addVector(const Vector &)");
}

Assistant:

void Vector::addVector(const Vector& source) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += source.data_[i];
  }
}